

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_loadDEntropy(ZSTD_entropyDTables_t *entropy,void *dict,size_t dictSize)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  void *workspace;
  uint *puVar6;
  uint *puVar7;
  ulong uVar8;
  bool bVar9;
  uint offcodeLog;
  uint offcodeMaxValue;
  short offcodeNCount [32];
  
  if (8 < dictSize) {
    if (*dict != -0x13cf5bc9) {
      __assert_fail("MEM_readLE32(dict) == ZSTD_MAGIC_DICTIONARY",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa0e3,
                    "size_t ZSTD_loadDEntropy(ZSTD_entropyDTables_t *, const void *const, const size_t)"
                   );
    }
    sVar3 = HUF_readDTableX2_wksp
                      (entropy->hufTable,(void *)((long)dict + 8),dictSize - 8,entropy,0x2818,0);
    if (sVar3 < 0xffffffffffffff89) {
      puVar7 = (uint *)(dictSize + (long)dict);
      puVar6 = (uint *)((long)dict + sVar3 + 8);
      offcodeMaxValue = 0x1f;
      bVar9 = false;
      sVar3 = FSE_readNCount_bmi2(offcodeNCount,&offcodeMaxValue,&offcodeLog,puVar6,
                                  (long)puVar7 - (long)puVar6,0);
      if (sVar3 < 0xffffffffffffff89) {
        if ((offcodeMaxValue < 0x20) && (offcodeLog < 9)) {
          ZSTD_buildFSETable(entropy->OFTable,offcodeNCount,offcodeMaxValue,OF_base,"",offcodeLog,
                             entropy->workspace,0x274,0);
          puVar6 = (uint *)((long)puVar6 + sVar3);
          bVar9 = true;
        }
        else {
          bVar9 = false;
        }
      }
      if (bVar9) {
        offcodeMaxValue = 0x34;
        bVar9 = false;
        sVar3 = FSE_readNCount_bmi2(offcodeNCount,&offcodeMaxValue,&offcodeLog,puVar6,
                                    (long)puVar7 - (long)puVar6,0);
        if (sVar3 < 0xffffffffffffff89) {
          if ((offcodeMaxValue < 0x35) && (offcodeLog < 10)) {
            ZSTD_buildFSETable(entropy->MLTable,offcodeNCount,offcodeMaxValue,ML_base,"",offcodeLog,
                               entropy->workspace,0x274,0);
            puVar6 = (uint *)((long)puVar6 + sVar3);
            bVar9 = true;
          }
          else {
            bVar9 = false;
          }
        }
        if (bVar9) {
          offcodeMaxValue = 0x23;
          bVar9 = false;
          sVar3 = FSE_readNCount_bmi2(offcodeNCount,&offcodeMaxValue,&offcodeLog,puVar6,
                                      (long)puVar7 - (long)puVar6,0);
          if (sVar3 < 0xffffffffffffff89) {
            if ((offcodeMaxValue < 0x24) && (offcodeLog < 10)) {
              ZSTD_buildFSETable(entropy->LLTable,offcodeNCount,offcodeMaxValue,LL_base,"",
                                 offcodeLog,entropy->workspace,0x274,0);
              puVar6 = (uint *)((long)puVar6 + sVar3);
              bVar9 = true;
            }
            else {
              bVar9 = false;
            }
          }
          if (!bVar9) {
            return 0xffffffffffffffe2;
          }
          if (puVar7 < puVar6 + 3) {
            return 0xffffffffffffffe2;
          }
          uVar8 = (long)puVar7 - (long)(puVar6 + 3);
          uVar1 = *puVar6;
          uVar4 = (ulong)uVar1;
          puVar6 = puVar6 + 1;
          if (uVar8 < uVar1 || uVar1 == 0) {
            bVar9 = false;
          }
          else {
            uVar2 = 0;
            while (uVar5 = uVar2, entropy->rep[uVar5] = (U32)uVar4, uVar5 != 2) {
              uVar4 = (ulong)*puVar6;
              puVar6 = puVar6 + 1;
              if ((uVar4 == 0) || (uVar2 = uVar5 + 1, uVar8 < uVar4)) break;
            }
            bVar9 = 1 < uVar5;
          }
          if (bVar9) {
            return (long)puVar6 - (long)dict;
          }
          return 0xffffffffffffffe2;
        }
      }
    }
  }
  return 0xffffffffffffffe2;
}

Assistant:

size_t
ZSTD_loadDEntropy(ZSTD_entropyDTables_t* entropy,
                  const void* const dict, size_t const dictSize)
{
    const BYTE* dictPtr = (const BYTE*)dict;
    const BYTE* const dictEnd = dictPtr + dictSize;

    RETURN_ERROR_IF(dictSize <= 8, dictionary_corrupted, "dict is too small");
    assert(MEM_readLE32(dict) == ZSTD_MAGIC_DICTIONARY);   /* dict must be valid */
    dictPtr += 8;   /* skip header = magic + dictID */

    ZSTD_STATIC_ASSERT(offsetof(ZSTD_entropyDTables_t, OFTable) == offsetof(ZSTD_entropyDTables_t, LLTable) + sizeof(entropy->LLTable));
    ZSTD_STATIC_ASSERT(offsetof(ZSTD_entropyDTables_t, MLTable) == offsetof(ZSTD_entropyDTables_t, OFTable) + sizeof(entropy->OFTable));
    ZSTD_STATIC_ASSERT(sizeof(entropy->LLTable) + sizeof(entropy->OFTable) + sizeof(entropy->MLTable) >= HUF_DECOMPRESS_WORKSPACE_SIZE);
    {   void* const workspace = &entropy->LLTable;   /* use fse tables as temporary workspace; implies fse tables are grouped together */
        size_t const workspaceSize = sizeof(entropy->LLTable) + sizeof(entropy->OFTable) + sizeof(entropy->MLTable);
#ifdef HUF_FORCE_DECOMPRESS_X1
        /* in minimal huffman, we always use X1 variants */
        size_t const hSize = HUF_readDTableX1_wksp(entropy->hufTable,
                                                dictPtr, dictEnd - dictPtr,
                                                workspace, workspaceSize, /* flags */ 0);
#else
        size_t const hSize = HUF_readDTableX2_wksp(entropy->hufTable,
                                                dictPtr, (size_t)(dictEnd - dictPtr),
                                                workspace, workspaceSize, /* flags */ 0);
#endif
        RETURN_ERROR_IF(HUF_isError(hSize), dictionary_corrupted, "");
        dictPtr += hSize;
    }

    {   short offcodeNCount[MaxOff+1];
        unsigned offcodeMaxValue = MaxOff, offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, (size_t)(dictEnd-dictPtr));
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(offcodeMaxValue > MaxOff, dictionary_corrupted, "");
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted, "");
        ZSTD_buildFSETable( entropy->OFTable,
                            offcodeNCount, offcodeMaxValue,
                            OF_base, OF_bits,
                            offcodeLog,
                            entropy->workspace, sizeof(entropy->workspace),
                            /* bmi2 */0);
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, (size_t)(dictEnd-dictPtr));
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(matchlengthMaxValue > MaxML, dictionary_corrupted, "");
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted, "");
        ZSTD_buildFSETable( entropy->MLTable,
                            matchlengthNCount, matchlengthMaxValue,
                            ML_base, ML_bits,
                            matchlengthLog,
                            entropy->workspace, sizeof(entropy->workspace),
                            /* bmi2 */ 0);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, (size_t)(dictEnd-dictPtr));
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted, "");
        RETURN_ERROR_IF(litlengthMaxValue > MaxLL, dictionary_corrupted, "");
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted, "");
        ZSTD_buildFSETable( entropy->LLTable,
                            litlengthNCount, litlengthMaxValue,
                            LL_base, LL_bits,
                            litlengthLog,
                            entropy->workspace, sizeof(entropy->workspace),
                            /* bmi2 */ 0);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted, "");
    {   int i;
        size_t const dictContentSize = (size_t)(dictEnd - (dictPtr+12));
        for (i=0; i<3; i++) {
            U32 const rep = MEM_readLE32(dictPtr); dictPtr += 4;
            RETURN_ERROR_IF(rep==0 || rep > dictContentSize,
                            dictionary_corrupted, "");
            entropy->rep[i] = rep;
    }   }

    return (size_t)(dictPtr - (const BYTE*)dict);
}